

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O2

void __thiscall chrono::ChMarker::ChMarker(ChMarker *this)

{
  double dVar1;
  ChQuaternion<double> local_48;
  ChVector<double> local_28;
  
  ChObj::ChObj(&this->super_ChObj);
  local_48.m_data[0] = (double)&DAT_3ff0000000000000;
  local_28.m_data[2] = 0.0;
  local_48.m_data[3] = 0.0;
  local_28.m_data[0] = 0.0;
  local_28.m_data[1] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&this->super_ChFrameMoving<double>,&local_28,&local_48);
  (this->super_ChObj)._vptr_ChObj = (_func_int **)&PTR__ChMarker_0114ef10;
  (this->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame =
       (_func_int **)&PTR__ChMarker_0114ef50;
  this->motion_type = M_MOTION_FUNCTIONS;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dVar1 = DAT_011dd428;
  (this->motion_axis).m_data[0] = VECT_Z;
  (this->motion_axis).m_data[1] = dVar1;
  (this->motion_axis).m_data[2] = DAT_011dd430;
  this->Body = (ChBody *)0x0;
  ChCoordsys<double>::ChCoordsys(&this->rest_coord,(ChCoordsys<double> *)CSYSNORM);
  ChCoordsys<double>::ChCoordsys(&this->last_rel_coord,(ChCoordsys<double> *)CSYSNORM);
  ChCoordsys<double>::ChCoordsys(&this->last_rel_coord_dt,(ChCoordsys<double> *)CSYSNULL);
  this->last_time = 0.0;
  local_48.m_data[0] = (double)&DAT_3ff0000000000000;
  local_48.m_data[3] = 0.0;
  local_28.m_data[2] = 0.0;
  local_28.m_data[0] = 0.0;
  local_28.m_data[1] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&this->abs_frame,&local_28,&local_48);
  local_28.m_data[0] = (double)((ulong)local_28.m_data[0] & 0xffffffff00000000);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_48);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->motion_X,
             (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48.m_data + 1));
  local_28.m_data[0] = (double)((ulong)local_28.m_data[0] & 0xffffffff00000000);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_48);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->motion_Y,
             (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48.m_data + 1));
  local_28.m_data[0] = (double)((ulong)local_28.m_data[0] & 0xffffffff00000000);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_48);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->motion_Z,
             (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48.m_data + 1));
  local_28.m_data[0] = (double)((ulong)local_28.m_data[0] & 0xffffffff00000000);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_48);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->motion_ang,
             (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48.m_data + 1));
  UpdateState(this);
  return;
}

Assistant:

ChMarker::ChMarker()
    : Body(NULL),
      rest_coord(CSYSNORM),
      motion_type(M_MOTION_FUNCTIONS),
      motion_axis(VECT_Z),
      last_rel_coord(CSYSNORM),
      last_rel_coord_dt(CSYSNULL),
      last_time(0) {
    motion_X = chrono_types::make_shared<ChFunction_Const>(0);  // default: no motion
    motion_Y = chrono_types::make_shared<ChFunction_Const>(0); 
    motion_Z = chrono_types::make_shared<ChFunction_Const>(0); 
    motion_ang = chrono_types::make_shared<ChFunction_Const>(0); 

    UpdateState();
}